

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_143273::BuildFileImpl::parseToolsMapping(BuildFileImpl *this,MappingNode *map)

{
  SequenceNode *pSVar1;
  uint uVar2;
  KeyValueNode *pKVar3;
  StringRef name_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  char cVar6;
  Node *pNVar8;
  MappingNode *C;
  SequenceNode *pSVar9;
  Node *pNVar10;
  long *plVar11;
  char *pcVar12;
  ScalarNode *scalar;
  ScalarNode *scalar_00;
  ScalarNode *scalar_01;
  ScalarNode *scalar_02;
  ScalarNode *extraout_RDX;
  ScalarNode *extraout_RDX_00;
  char *pcVar13;
  ScalarNode *pSVar14;
  StringRef message;
  StringRef message_00;
  StringRef message_01;
  StringRef message_02;
  StringRef message_03;
  string key;
  string value;
  iterator __begin2;
  iterator __begin5;
  string attribute;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string name;
  string local_128;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [32];
  Tool *local_a8;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_a0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_98;
  string local_90;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_70;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  string local_50;
  int iVar7;
  
  local_a0.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_a0.Base != (MappingNode *)0x0) {
    pSVar1 = (SequenceNode *)(local_108 + 0x10);
    do {
      pKVar3 = (local_a0.Base)->CurrentEntry;
      if (pKVar3 == (KeyValueNode *)0x0) {
LAB_0013ae63:
        pcVar13 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_0013ae8f:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar13);
      }
      pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
      if (pNVar8->TypeID == 1) {
        pNVar8 = llvm::yaml::KeyValueNode::getValue(pKVar3);
        if (pNVar8->TypeID != 4) {
          pNVar10 = llvm::yaml::KeyValueNode::getValue(pKVar3);
          pNVar8 = (Node *)(pNVar10->SourceRange).Start.Ptr;
          pcVar13 = (pNVar10->SourceRange).End.Ptr;
          pcVar12 = "invalid value type in \'tools\' map";
          goto LAB_0013adee;
        }
        pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  (&local_50,pNVar8,scalar);
        C = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
        name_00.Length = local_50._M_string_length;
        name_00.Data = local_50._M_dataplus._M_p;
        pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        local_a8 = getOrCreateTool(this,name_00,pNVar8);
        if (local_a8 == (Tool *)0x0) {
          iVar7 = 1;
        }
        else {
          local_70.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(C);
          while (local_70.Base != (MappingNode *)0x0) {
            pKVar3 = (local_70.Base)->CurrentEntry;
            if (pKVar3 == (KeyValueNode *)0x0) goto LAB_0013ae63;
            pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            pSVar9 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            if (pNVar8->TypeID == 1) {
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&local_90,pNVar8,scalar_00);
              sVar5 = local_90._M_string_length;
              _Var4._M_p = local_90._M_dataplus._M_p;
              uVar2 = (pSVar9->super_Node).TypeID;
              if (uVar2 == 1) {
                local_108._24_8_ = (pNVar8->SourceRange).Start.Ptr;
                local_108._0_8_ = this->delegate;
                local_108._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                local_108._16_8_ = (this->mainFilename)._M_string_length;
                local_e8._M_p._0_4_ = *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._24_8_
                ;
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          (&local_128,pSVar9,(ScalarNode *)local_108._16_8_);
                iVar7 = (*local_a8->_vptr_Tool[2])
                                  (local_a8,local_108,_Var4._M_p,sVar5,local_128._M_dataplus._M_p,
                                   local_128._M_string_length);
                cVar6 = (char)iVar7;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  operator_delete(local_128._M_dataplus._M_p,
                                  local_128.field_2._M_allocated_capacity + 1);
                }
LAB_0013ad28:
                iVar7 = 1;
                if (cVar6 != '\0') {
                  iVar7 = 0;
                }
              }
              else {
                if (uVar2 == 5) {
                  local_128._M_dataplus._M_p = (pointer)0x0;
                  local_128._M_string_length = 0;
                  local_128.field_2._M_allocated_capacity = 0;
                  local_c8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(pSVar9);
                  pSVar14 = extraout_RDX;
                  _Var4._M_p = local_90._M_dataplus._M_p;
                  sVar5 = local_90._M_string_length;
                  while (local_90._M_dataplus._M_p = _Var4._M_p, local_90._M_string_length = sVar5,
                        (SequenceNode *)local_c8._0_8_ != (SequenceNode *)0x0) {
                    pNVar10 = ((SequenceNode *)local_c8._0_8_)->CurrentEntry;
                    if (pNVar10 == (Node *)0x0) {
                      pcVar13 = 
                      "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
                      ;
                      goto LAB_0013ae8f;
                    }
                    if (pNVar10->TypeID == 1) {
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)local_108,pNVar10,pSVar14);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_128,(string *)local_108);
                      if ((SequenceNode *)local_108._0_8_ != pSVar1) {
                        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                      }
                    }
                    else {
                      message_01.Length = (size_t)"invalid value type for tool in \'tools\' map";
                      message_01.Data = (pNVar10->SourceRange).End.Ptr;
                      error(this,(Node *)(pNVar10->SourceRange).Start.Ptr,message_01);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                    operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                *)local_c8);
                    pSVar14 = extraout_RDX_00;
                    _Var4._M_p = local_90._M_dataplus._M_p;
                    sVar5 = local_90._M_string_length;
                  }
                  local_108._24_8_ = (pNVar8->SourceRange).Start.Ptr;
                  local_108._0_8_ = this->delegate;
                  local_108._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                  local_108._16_8_ = (this->mainFilename)._M_string_length;
                  local_e8._M_p._4_4_ = (undefined4)((ulong)local_e8._M_p >> 0x20);
                  local_e8._M_p._0_4_ =
                       *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._24_8_;
                  local_c8._0_8_ = (SequenceNode *)0x0;
                  local_c8._8_8_ = 0;
                  local_c8._16_8_ = (ScalarNode *)0x0;
                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)local_c8,
                             local_128._M_dataplus._M_p,local_128._M_string_length);
                  iVar7 = (*local_a8->_vptr_Tool[3])
                                    (local_a8,local_108,_Var4._M_p,sVar5,local_c8._0_8_,
                                     (long)(local_c8._8_8_ - local_c8._0_8_) >> 4);
                  cVar6 = (char)iVar7;
                  if ((SequenceNode *)local_c8._0_8_ != (SequenceNode *)0x0) {
                    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_128);
                  goto LAB_0013ad28;
                }
                if (uVar2 == 4) {
                  local_68.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_68.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_68.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_98.Base =
                       (MappingNode *)
                       llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)pSVar9);
                  _Var4._M_p = local_90._M_dataplus._M_p;
                  sVar5 = local_90._M_string_length;
                  while (local_90._M_dataplus._M_p = _Var4._M_p, local_90._M_string_length = sVar5,
                        local_98.Base != (MappingNode *)0x0) {
                    pKVar3 = (local_98.Base)->CurrentEntry;
                    if (pKVar3 == (KeyValueNode *)0x0) goto LAB_0013ae63;
                    pNVar10 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                    if (pNVar10->TypeID == 1) {
                      pNVar10 = llvm::yaml::KeyValueNode::getValue(pKVar3);
                      if (pNVar10->TypeID != 1) {
                        pNVar10 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                        pcVar13 = "invalid value type for \'";
                        goto LAB_0013a9b6;
                      }
                      pNVar10 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&local_128,pNVar10,scalar_01);
                      pNVar10 = llvm::yaml::KeyValueNode::getValue(pKVar3);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)local_c8,pNVar10,scalar_02);
                      local_108._0_8_ = pSVar1;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_108,local_128._M_dataplus._M_p,
                                 local_128._M_dataplus._M_p + local_128._M_string_length);
                      local_e8._M_p = (pointer)&local_d8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_e8,local_c8._0_8_,
                                 (long)&((Node *)local_c8._0_8_)->_vptr_Node + local_c8._8_8_);
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&local_68,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_108);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_p != &local_d8) {
                        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
                      }
                      if ((SequenceNode *)local_108._0_8_ != pSVar1) {
                        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                      }
                      pSVar14 = (ScalarNode *)local_c8._16_8_;
                      pSVar9 = (SequenceNode *)local_c8._0_8_;
                      if ((SequenceNode *)local_c8._0_8_ != (SequenceNode *)(local_c8 + 0x10))
                      goto LAB_0013aa3a;
                    }
                    else {
                      pNVar10 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                      pcVar13 = "invalid key type for \'";
LAB_0013a9b6:
                      std::operator+(&local_128,pcVar13,&local_90);
                      plVar11 = (long *)std::__cxx11::string::append((char *)&local_128);
                      pSVar9 = (SequenceNode *)(plVar11 + 2);
                      if ((SequenceNode *)*plVar11 == pSVar9) {
                        local_108._16_8_ = (pSVar9->super_Node)._vptr_Node;
                        local_108._24_8_ = plVar11[3];
                        local_108._0_8_ = pSVar1;
                      }
                      else {
                        local_108._16_8_ = (pSVar9->super_Node)._vptr_Node;
                        local_108._0_8_ = (SequenceNode *)*plVar11;
                      }
                      local_108._8_8_ = plVar11[1];
                      *plVar11 = (long)pSVar9;
                      plVar11[1] = 0;
                      *(undefined1 *)(plVar11 + 2) = 0;
                      message.Length = local_108._0_8_;
                      message.Data = (pNVar10->SourceRange).End.Ptr;
                      error(this,(Node *)(pNVar10->SourceRange).Start.Ptr,message);
                      pSVar14 = (ScalarNode *)local_108._16_8_;
                      pSVar9 = (SequenceNode *)local_108._0_8_;
                      if ((SequenceNode *)local_108._0_8_ != pSVar1) {
LAB_0013aa3a:
                        operator_delete(pSVar9,(ulong)((long)&(pSVar14->super_Node)._vptr_Node + 1))
                        ;
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&local_98);
                    _Var4._M_p = local_90._M_dataplus._M_p;
                    sVar5 = local_90._M_string_length;
                  }
                  local_108._24_8_ = (pNVar8->SourceRange).Start.Ptr;
                  local_108._0_8_ = this->delegate;
                  local_108._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                  local_108._16_8_ = (this->mainFilename)._M_string_length;
                  local_e8._M_p._4_4_ = (undefined4)((ulong)local_e8._M_p >> 0x20);
                  local_e8._M_p._0_4_ =
                       *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._24_8_;
                  local_128._M_dataplus._M_p = (pointer)0x0;
                  local_128._M_string_length = 0;
                  local_128.field_2._M_allocated_capacity = 0;
                  std::
                  vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                  ::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                            ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                              *)&local_128,
                             local_68.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_68.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  iVar7 = (*local_a8->_vptr_Tool[4])
                                    (local_a8,local_108,_Var4._M_p,sVar5,local_128._M_dataplus._M_p,
                                     (long)(local_128._M_string_length -
                                           (long)local_128._M_dataplus._M_p) >> 5);
                  cVar6 = (char)iVar7;
                  if (local_128._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    local_128.field_2._M_allocated_capacity -
                                    (long)local_128._M_dataplus._M_p);
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_68);
                  goto LAB_0013ad28;
                }
                message_02.Length = (size_t)"invalid value type for tool in \'tools\' map";
                message_02.Data = (pSVar9->super_Node).SourceRange.End.Ptr;
                error(this,(Node *)(pSVar9->super_Node).SourceRange.Start.Ptr,message_02);
                iVar7 = 5;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((iVar7 != 5) && (iVar7 != 0)) goto LAB_0013ae13;
            }
            else {
              message_00.Length = (size_t)"invalid key type for tool in \'tools\' map";
              message_00.Data = (pNVar8->SourceRange).End.Ptr;
              error(this,(Node *)(pNVar8->SourceRange).Start.Ptr,message_00);
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_70);
          }
          iVar7 = 0;
        }
LAB_0013ae13:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((iVar7 != 3) && (iVar7 != 0)) {
          return false;
        }
      }
      else {
        pNVar10 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        pNVar8 = (Node *)(pNVar10->SourceRange).Start.Ptr;
        pcVar13 = (pNVar10->SourceRange).End.Ptr;
        pcVar12 = "invalid key type in \'tools\' map";
LAB_0013adee:
        message_03.Length = (size_t)pcVar12;
        message_03.Data = pcVar13;
        error(this,pNVar8,message_03);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_a0);
    } while (local_a0.Base != (MappingNode *)0x0);
  }
  return true;
}

Assistant:

bool parseToolsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'tools' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'tools' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Get the tool.
      auto tool = getOrCreateTool(name, entry.getKey());
      if (!tool) {
        return false;
      }

      // Configure all of the tool attributes.
      for (auto& valueEntry: *attrs) {
        auto key = valueEntry.getKey();
        auto value = valueEntry.getValue();
        
        // All keys must be scalar.
        if (key->getType() != llvm::yaml::Node::NK_Scalar) {
          error(key, "invalid key type for tool in 'tools' map");
          continue;
        }


        auto attribute = stringFromScalarNode(
            static_cast<llvm::yaml::ScalarNode*>(key));

        if (value->getType() == llvm::yaml::Node::NK_Mapping) {
          std::vector<std::pair<std::string, std::string>> values;
          for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
            // Every key must be scalar.
            if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid key type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }
            // Every value must be scalar.
            if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid value type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }

            std::string key = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
            std::string value = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
            values.push_back(std::make_pair(key, value));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<std::pair<StringRef, StringRef>>(
                      values.begin(), values.end()))) {
            return false;
          }
        } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
          std::vector<std::string> values;
          for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
            if (node.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&node, "invalid value type for tool in 'tools' map");
              continue;
            }
            values.push_back(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<StringRef>(values.begin(), values.end()))) {
            return false;
          }
        } else {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for tool in 'tools' map");
            continue;
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(value)))) {
            return false;
          }
        }
      }
    }

    return true;
  }